

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_DST(Context *ctx)

{
  size_t in_RCX;
  char *buflen;
  size_t in_R8;
  char *buf;
  char src1_w [64];
  char src0_z [64];
  char src1_y [64];
  char src0_y [64];
  char code [128];
  
  make_METAL_srcarg_string_y(ctx,0,src0_y,in_RCX);
  make_METAL_srcarg_string_y(ctx,1,src1_y,in_RCX);
  buf = src0_z;
  buflen = buf;
  make_METAL_srcarg_string(ctx,0,4,buf,in_R8);
  make_METAL_srcarg_string_w(ctx,1,src1_w,(size_t)buflen);
  make_METAL_destarg_assign(ctx,code,0x80,"float4(1.0, %s * %s, %s, %s)",src0_y,src1_y,buf,src1_w);
  output_line(ctx,"%s",code,buf);
  return;
}

Assistant:

static void emit_METAL_DST(Context *ctx)
{
    // !!! FIXME: needs to take ctx->dst_arg.writemask into account.
    char src0_y[64]; make_METAL_srcarg_string_y(ctx, 0, src0_y, sizeof (src0_y));
    char src1_y[64]; make_METAL_srcarg_string_y(ctx, 1, src1_y, sizeof (src1_y));
    char src0_z[64]; make_METAL_srcarg_string_z(ctx, 0, src0_z, sizeof (src0_z));
    char src1_w[64]; make_METAL_srcarg_string_w(ctx, 1, src1_w, sizeof (src1_w));

    char code[128];
    make_METAL_destarg_assign(ctx, code, sizeof (code),
                             "float4(1.0, %s * %s, %s, %s)",
                             src0_y, src1_y, src0_z, src1_w);
    output_line(ctx, "%s", code);
}